

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall Fl_Window::resize(Fl_Window *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *pFVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int local_ac;
  int local_a4;
  int local_8c;
  int local_84;
  int resize_from_program;
  int is_a_resize;
  int is_a_move;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Window *this_local;
  
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  bVar6 = true;
  if (X == iVar1) {
    iVar1 = Fl_Widget::y((Fl_Widget *)this);
    bVar6 = Y != iVar1;
  }
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  bVar7 = true;
  if (W == iVar1) {
    iVar1 = Fl_Widget::h((Fl_Widget *)this);
    bVar7 = H != iVar1;
  }
  bVar8 = this != resize_bug_fix;
  if (!bVar8) {
    resize_bug_fix = (Fl_Window *)0x0;
  }
  if ((bVar6) && (bVar8)) {
    Fl_Widget::set_flag((Fl_Widget *)this,0x10);
  }
  else if ((!bVar7) && (!bVar6)) {
    return;
  }
  if (bVar7) {
    Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
    iVar1 = shown(this);
    if (iVar1 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  else {
    Fl_Widget::x((Fl_Widget *)this,X);
    Fl_Widget::y((Fl_Widget *)this,Y);
  }
  if (((bVar8) && (bVar7)) &&
     (pFVar5 = Fl_Group::resizable(&this->super_Fl_Group), pFVar5 == (Fl_Widget *)0x0)) {
    iVar1 = Fl_Widget::w((Fl_Widget *)this);
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    iVar3 = Fl_Widget::w((Fl_Widget *)this);
    iVar4 = Fl_Widget::h((Fl_Widget *)this);
    size_range(this,iVar1,iVar2,iVar3,iVar4,0,0,0);
  }
  if ((bVar8) && (iVar1 = shown(this), iVar1 != 0)) {
    if (bVar7) {
      pFVar5 = Fl_Group::resizable(&this->super_Fl_Group);
      if (pFVar5 == (Fl_Widget *)0x0) {
        iVar1 = Fl_Widget::w((Fl_Widget *)this);
        iVar2 = Fl_Widget::h((Fl_Widget *)this);
        iVar3 = Fl_Widget::w((Fl_Widget *)this);
        iVar4 = Fl_Widget::h((Fl_Widget *)this);
        size_range(this,iVar1,iVar2,iVar3,iVar4,0,0,0);
      }
      if (bVar6) {
        local_84 = W;
        if (W < 1) {
          local_84 = 1;
        }
        local_8c = H;
        if (H < 1) {
          local_8c = 1;
        }
        XMoveResizeWindow(fl_display,this->i->xid,X,Y,local_84,local_8c);
      }
      else {
        local_a4 = W;
        if (W < 1) {
          local_a4 = 1;
        }
        local_ac = H;
        if (H < 1) {
          local_ac = 1;
        }
        XResizeWindow(fl_display,this->i->xid,local_a4,local_ac);
      }
    }
    else {
      XMoveWindow(fl_display,this->i->xid,X,Y);
    }
  }
  return;
}

Assistant:

void Fl_Window::resize(int X,int Y,int W,int H) {
  int is_a_move = (X != x() || Y != y());
  int is_a_resize = (W != w() || H != h());
  int resize_from_program = (this != resize_bug_fix);
  if (!resize_from_program) resize_bug_fix = 0;
  if (is_a_move && resize_from_program) set_flag(FORCE_POSITION);
  else if (!is_a_resize && !is_a_move) return;
  if (is_a_resize) {
    Fl_Group::resize(X,Y,W,H);
    if (shown()) {redraw();}
  } else {
    x(X); y(Y);
  }

  if (resize_from_program && is_a_resize && !resizable()) {
    size_range(w(), h(), w(), h());
  }

  if (resize_from_program && shown()) {
    if (is_a_resize) {
      if (!resizable()) size_range(w(),h(),w(),h());
      if (is_a_move) {
        XMoveResizeWindow(fl_display, i->xid, X, Y, W>0 ? W : 1, H>0 ? H : 1);
      } else {
        XResizeWindow(fl_display, i->xid, W>0 ? W : 1, H>0 ? H : 1);
      }
    } else
      XMoveWindow(fl_display, i->xid, X, Y);
  }
}